

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmmulticast.c
# Opt level: O0

int libcmmulticast_LTX_writev_func
              (CMtrans_services_conflict svc,mcast_conn_data_ptr mcd,iovec *iov,int iovcnt,
              attr_list attrs)

{
  uint32_t uVar1;
  int iVar2;
  ssize_t sVar3;
  int in_ECX;
  iovec *in_RDX;
  long in_RSI;
  long in_RDI;
  int IP;
  uint nl;
  msghdr msg;
  sockaddr_in addr;
  int fd;
  CMtrans_services_conflict in_stack_000001e0;
  void *in_stack_000001e8;
  socklen_t local_7c;
  msghdr local_78;
  undefined8 local_3c;
  undefined8 local_34;
  int local_2c;
  int local_1c;
  iovec *local_18;
  long local_10;
  
  local_2c = *(int *)(in_RSI + 0xc);
  local_3c = *(undefined8 *)(in_RSI + 0x10);
  local_34 = *(undefined8 *)(in_RSI + 0x18);
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  (**(code **)(in_RDI + 0x30))
            (**(undefined8 **)(in_RSI + 0x6440),"CMMcast writev of %d vectors on fd %d",in_ECX,
             local_2c);
  memset(&local_78,0,0x38);
  local_78.msg_name = &local_3c;
  local_78.msg_namelen = 0x10;
  local_78.msg_iov = local_18;
  local_78.msg_iovlen = (size_t)local_1c;
  sVar3 = sendmsg(local_2c,&local_78,0);
  if (sVar3 < 0) {
    perror("write sendmsg");
    exit(1);
  }
  if (*(short *)(local_10 + 0x22) == 0) {
    uVar1 = get_self_ip_addr(in_stack_000001e8,in_stack_000001e0);
    local_7c = 0x10;
    iVar2 = getsockname(local_2c,(sockaddr *)(local_10 + 0x20),&local_7c);
    if (iVar2 != 0) {
      perror("getsockname");
    }
    uVar1 = htonl(uVar1);
    *(uint32_t *)(local_10 + 0x24) = uVar1;
  }
  return local_1c;
}

Assistant:

extern int
libcmmulticast_LTX_writev_func(CMtrans_services svc, mcast_conn_data_ptr mcd, struct iovec *iov, int iovcnt, attr_list attrs)
{
    SOCKET fd = mcd->output_fd;
#ifndef _MSC_VER
    // no real equivalent on windows
    struct sockaddr_in addr = mcd->output_addr;
    struct msghdr msg;
    svc->trace_out(mcd->mtd->cm, "CMMcast writev of %d vectors on fd %d",
		   iovcnt, fd);
    memset(&msg, 0, sizeof(msg));
    msg.msg_name = (void*)&addr;
    msg.msg_namelen = sizeof(addr);
    msg.msg_iov = &iov[0];
    msg.msg_iovlen = iovcnt;
    if (sendmsg(fd, &msg, 0) < 0) {
	perror("write sendmsg");
	exit(1);
    }
#endif
    if (mcd->my_addr.sin_port == 0) {
	unsigned int nl;
	int IP = get_self_ip_addr(NULL, svc);
	nl = sizeof(struct sockaddr_in);
	if (getsockname(fd, (struct sockaddr *) &mcd->my_addr, &nl) != 0)
	    perror("getsockname");


	mcd->my_addr.sin_addr.s_addr = htonl(IP);
    }
    return iovcnt;
}